

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::RepeatedMessageFieldGenerator::DetermineForwardDeclarations
          (RepeatedMessageFieldGenerator *this,
          btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *fwd_decls,bool include_external_types)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined7 in_register_00000011;
  undefined1 local_110 [32];
  string local_f0;
  pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_bool>
  local_d0;
  string_view local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  FieldGenerator::DetermineForwardDeclarations
            ((FieldGenerator *)this,fwd_decls,include_external_types);
  if ((int)CONCAT71(in_register_00000011,include_external_types) != 0) {
    lVar2 = google::protobuf::FieldDescriptor::message_type();
    bVar1 = IsProtobufLibraryBundledProtoFile(*(FileDescriptor **)(lVar2 + 0x10));
    if (!bVar1) goto LAB_00266715;
  }
  lVar2 = *(long *)((this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
                    super_SingleFieldGenerator.super_FieldGenerator.descriptor_ + 0x10);
  lVar3 = google::protobuf::FieldDescriptor::message_type();
  if (lVar2 != *(long *)(lVar3 + 0x10)) {
    return;
  }
LAB_00266715:
  local_58.piece_ = absl::lts_20240722::NullSafeStringView("@class ");
  FieldGenerator::variable_abi_cxx11_(&local_f0,(FieldGenerator *)this,"msg_type");
  local_88.piece_._M_len = local_f0._M_string_length;
  local_88.piece_._M_str = local_f0._M_dataplus._M_p;
  local_b8 = absl::lts_20240722::NullSafeStringView(";");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_110,&local_58,&local_88);
  absl::lts_20240722::container_internal::
  btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
  ::insert(&local_d0,
           &fwd_decls->
            super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>_>
           ,(value_type *)local_110);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::DetermineForwardDeclarations(
    absl::btree_set<std::string>* fwd_decls,
    bool include_external_types) const {
  RepeatedFieldGenerator::DetermineForwardDeclarations(fwd_decls,
                                                       include_external_types);
  // Within a file there is no requirement on the order of the messages, so
  // local references need a forward declaration. External files (not WKTs),
  // need one when requested.
  if ((include_external_types && !IsProtobufLibraryBundledProtoFile(
                                     descriptor_->message_type()->file())) ||
      descriptor_->file() == descriptor_->message_type()->file()) {
    fwd_decls->insert(absl::StrCat("@class ", variable("msg_type"), ";"));
  }
}